

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O3

LargeRep * __thiscall
google::protobuf::internal::MicroString::AllocateOwnedRep
          (MicroString *this,size_t size,Arena *arena)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  LargeRepKind LVar3;
  void *pvVar4;
  char *pcVar5;
  LargeRep *this_00;
  ulong n;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  
  if (size < 3) {
    AllocateOwnedRep();
  }
  else {
    n = size + 0x17 & 0xfffffffffffffff8;
    if (arena == (Arena *)0x0) {
      if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
        pvVar4 = operator_new(n);
        auVar6._8_8_ = n;
        auVar6._0_8_ = pvVar4;
        auVar2 = auVar6._0_12_;
      }
      else {
        auVar6 = (**(code **)(in_FS_OFFSET + -0x48))(n,*(undefined8 *)(in_FS_OFFSET + -0x40));
        auVar2 = auVar6._0_12_;
      }
    }
    else {
      pvVar4 = Arena::Allocate(arena,n);
      auVar1._8_8_ = n;
      auVar1._0_8_ = pvVar4;
      auVar2 = auVar1._0_12_;
    }
    this_00 = auVar2._0_8_;
    this->rep_ = (void *)((ulong)this_00 | 1);
    this_00->capacity = auVar2._8_4_ - 0x10;
    pcVar5 = LargeRep::owned_head(this_00);
    this_00->payload = pcVar5;
    LargeRep::owned_head(this_00);
    this_00->size = (uint32_t)size;
    LVar3 = large_rep_kind(this);
    if (LVar3 == kOwned) {
      return this_00;
    }
  }
  AllocateOwnedRep();
}

Assistant:

MicroString::LargeRep* MicroString::AllocateOwnedRep(size_t size,
                                                     Arena* arena) {
  size_t capacity = size;
  LargeRep* h;
  ABSL_DCHECK_GE(capacity, kOwned);
  if (arena == nullptr) {
    const internal::SizedPtr alloc = internal::AllocateAtLeast(
        ArenaAlignDefault::Ceil(OwnedRepSize(capacity)));
    capacity = alloc.n - sizeof(LargeRep);
    h = reinterpret_cast<LargeRep*>(alloc.p);
  } else {
    size_t alloc_size = ArenaAlignDefault::Ceil(OwnedRepSize(capacity));
    capacity = alloc_size - sizeof(LargeRep);
    auto* alloc = arena->AllocateAligned(alloc_size);
    h = reinterpret_cast<LargeRep*>(alloc);
  }

  rep_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) | kIsLargeRepTag);
  h->capacity = capacity;
  h->payload = h->owned_head();
  h->SetInitialSize(size);

  ABSL_DCHECK_EQ(+large_rep_kind(), +kOwned);

  return h;
}